

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_json_mapping_api.cpp
# Opt level: O2

string * __thiscall
cfd::js::api::json::
ExecuteJsonApi<cfd::js::api::json::CreateDestroyAmountRequest,cfd::js::api::json::RawTransactionResponse,cfd::js::api::CreateDestroyAmountRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (string *__return_storage_ptr__,json *this,string *request_message,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&)>
          *call_function)

{
  string sStack_458;
  RawTransactionResponse res;
  CreateDestroyAmountRequestStruct request;
  RawTransactionResponseStruct response;
  CreateDestroyAmountRequest req;
  
  CreateDestroyAmountRequest::CreateDestroyAmountRequest(&req);
  core::JsonClassBase<cfd::js::api::json::CreateDestroyAmountRequest>::Deserialize
            (&req.super_JsonClassBase<cfd::js::api::json::CreateDestroyAmountRequest>,(string *)this
            );
  CreateDestroyAmountRequest::ConvertToStruct(&request,&req);
  std::
  function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&)>
  ::operator()(&response,
               (function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::CreateDestroyAmountRequestStruct_&)>
                *)request_message,&request);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (response.error.code == 0) {
    RawTransactionResponse::RawTransactionResponse(&res);
    RawTransactionResponse::ConvertFromStruct(&res,&response);
    core::JsonClassBase<cfd::js::api::json::RawTransactionResponse>::Serialize_abi_cxx11_
              (&sStack_458,&res.super_JsonClassBase<cfd::js::api::json::RawTransactionResponse>);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_458);
    std::__cxx11::string::~string((string *)&sStack_458);
    RawTransactionResponse::~RawTransactionResponse(&res);
  }
  else {
    ErrorResponse::ConvertFromStruct((ErrorResponse *)&res,&response.error);
    core::JsonClassBase<cfd::js::api::json::ErrorResponseBase>::Serialize_abi_cxx11_
              (&sStack_458,(JsonClassBase<cfd::js::api::json::ErrorResponseBase> *)&res);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&sStack_458);
    std::__cxx11::string::~string((string *)&sStack_458);
    ErrorResponseBase::~ErrorResponseBase((ErrorResponseBase *)&res);
  }
  RawTransactionResponseStruct::~RawTransactionResponseStruct(&response);
  CreateDestroyAmountRequestStruct::~CreateDestroyAmountRequestStruct(&request);
  CreateDestroyAmountRequest::~CreateDestroyAmountRequest(&req);
  return __return_storage_ptr__;
}

Assistant:

std::string ExecuteJsonApi(
    const std::string &request_message,
    std::function<ResponseStructType(const RequestStructType &)>
        call_function) {
  // リクエストjson_strから、モデルへ変換
  RequestType req;
  try {
    req.Deserialize(request_message);
  } catch (const CfdException &cfd_except) {
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(cfd_except);
    return res.Serialize();
  } catch (...) {
    CfdException ex(
        CfdError::kCfdOutOfRangeError,
        "JSON value convert error. Value out of range.");
    ErrorResponse res = ErrorResponse::ConvertFromCfdException(ex);
    return res.Serialize();
  }
  RequestStructType request = req.ConvertToStruct();
  ResponseStructType response = call_function(request);
  std::string json_message;
  if (response.error.code == 0) {
    ResponseType res;
    res.ConvertFromStruct(response);
    json_message = res.Serialize();
  } else {
    json_message =
        ErrorResponse::ConvertFromStruct(response.error).Serialize();
  }

  // utf-8
  return json_message;
}